

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# batch_memory_manager.hpp
# Opt level: O2

void __thiscall
duckdb::BatchMemoryManager::BatchMemoryManager
          (BatchMemoryManager *this,ClientContext *context,idx_t initial_memory_request)

{
  undefined8 __p;
  pointer in_RAX;
  ClientContext *context_00;
  undefined8 local_28;
  
  (this->super_StateWithBlockableTasks).can_block._M_base._M_i = true;
  (this->super_StateWithBlockableTasks).lock.super___mutex_base._M_mutex.__align = 0;
  *(undefined8 *)((long)&(this->super_StateWithBlockableTasks).lock.super___mutex_base._M_mutex + 8)
       = 0;
  *(undefined8 *)
   ((long)&(this->super_StateWithBlockableTasks).lock.super___mutex_base._M_mutex + 0x10) = 0;
  (this->super_StateWithBlockableTasks).lock.super___mutex_base._M_mutex.__data.__list.__prev =
       (__pthread_internal_list *)0x0;
  (this->super_StateWithBlockableTasks).lock.super___mutex_base._M_mutex.__data.__list.__next =
       (__pthread_internal_list *)0x0;
  (this->super_StateWithBlockableTasks).blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->super_StateWithBlockableTasks).blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->super_StateWithBlockableTasks).blocked_tasks.
  super_vector<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>.
  super__Vector_base<duckdb::InterruptState,_std::allocator<duckdb::InterruptState>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->context = context;
  (this->memory_state).
  super_unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>
  ._M_t.
  super___uniq_ptr_impl<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>
  ._M_t.
  super__Tuple_impl<0UL,_duckdb::TemporaryMemoryState_*,_std::default_delete<duckdb::TemporaryMemoryState>_>
  .super__Head_base<0UL,_duckdb::TemporaryMemoryState_*,_false>._M_head_impl =
       (TemporaryMemoryState *)0x0;
  (this->unflushed_memory_usage).super___atomic_base<unsigned_long>._M_i = 0;
  (this->min_batch_index).super___atomic_base<unsigned_long>._M_i = 0;
  (this->available_memory).super___atomic_base<unsigned_long>._M_i = 0;
  this->can_increase_memory = true;
  local_28 = in_RAX;
  context_00 = (ClientContext *)TemporaryMemoryManager::Get(context);
  TemporaryMemoryManager::Register((TemporaryMemoryManager *)&stack0xffffffffffffffd8,context_00);
  __p = local_28;
  local_28 = 0;
  ::std::
  __uniq_ptr_impl<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>
  ::reset((__uniq_ptr_impl<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>
           *)&this->memory_state,(pointer)__p);
  ::std::
  unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>::
  ~unique_ptr((unique_ptr<duckdb::TemporaryMemoryState,_std::default_delete<duckdb::TemporaryMemoryState>_>
               *)&stack0xffffffffffffffd8);
  SetMemorySize(this,initial_memory_request);
  return;
}

Assistant:

BatchMemoryManager(ClientContext &context, idx_t initial_memory_request)
	    : context(context), unflushed_memory_usage(0), min_batch_index(0), available_memory(0),
	      can_increase_memory(true) {
		memory_state = TemporaryMemoryManager::Get(context).Register(context);
		SetMemorySize(initial_memory_request);
	}